

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::pixie::LoginMessage::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LoginMessage *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Login(username=",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->username_)._M_dataplus._M_p,
                      (this->username_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", password=***",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", alias=",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->alias_)._M_dataplus._M_p,(this->alias_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", application=",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->application_)._M_dataplus._M_p,
                      (this->application_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", version=",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->application_version_)._M_dataplus._M_p,
                      (this->application_version_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", api=",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->api_)._M_dataplus._M_p,(this->api_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", api_version=",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->api_version_)._M_dataplus._M_p,
                      (this->api_version_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", product=",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->product_)._M_dataplus._M_p,(this->product_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", product_serial_number=",0x18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->product_serial_number_)._M_dataplus._M_p,
                      (this->product_serial_number_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string LoginMessage::ToString()
{
    std::stringstream ss;
    ss << "Login(username=" << username_ << ", password=***" << ", alias=" << alias_ <<
       ", application=" << application_ << ", version=" << application_version_ <<
       ", api=" << api_ << ", api_version=" << api_version_ << ", product=" << product_ <<
       ", product_serial_number=" << product_serial_number_ << ")";
    return ss.str();
}